

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

bool bssl::ssl_session_is_context_valid(SSL_HANDSHAKE *hs,SSL_SESSION *session)

{
  pointer pCVar1;
  bool local_39;
  Span<const_unsigned_char> local_38;
  Span<const_unsigned_char> local_28;
  SSL_SESSION *local_18;
  SSL_SESSION *session_local;
  SSL_HANDSHAKE *hs_local;
  
  local_39 = false;
  if (session != (SSL_SESSION *)0x0) {
    local_18 = session;
    session_local = (SSL_SESSION *)hs;
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,32ul>,void,bssl::InplaceVector<unsigned_char,32ul>>
              ((Span<unsigned_char_const> *)&local_28,&session->sid_ctx);
    pCVar1 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<bssl::CERT,_bssl::internal::Deleter> *)
                        (*(long *)&session_local->peer_signature_algorithm + 0x20));
    Span<unsigned_char_const>::
    Span<bssl::InplaceVector<unsigned_char,32ul>,void,bssl::InplaceVector<unsigned_char,32ul>>
              ((Span<unsigned_char_const> *)&local_38,&pCVar1->sid_ctx);
    local_39 = internal::operator==(local_28,local_38);
  }
  return local_39;
}

Assistant:

bool ssl_session_is_context_valid(const SSL_HANDSHAKE *hs,
                                  const SSL_SESSION *session) {
  return session != nullptr &&
         Span(session->sid_ctx) == hs->config->cert->sid_ctx;
}